

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSemantic.cpp
# Opt level: O3

void __thiscall UnitTest_semantic20::UnitTest_semantic20(UnitTest_semantic20 *this)

{
  UnitTestBase::UnitTestBase(&this->super_UnitTestBase);
  (this->super_UnitTestBase)._vptr_UnitTestBase = (_func_int **)&PTR_Run_001864c8;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_UnitTestBase).test_name_,0,
             (char *)(this->super_UnitTestBase).test_name_._M_string_length,0x167c7d);
  return;
}

Assistant:

TEST_CASE(semantic20)
{
    EXPECT_EXCEPTION(luna::SemanticException, {
        Semantic("do break end");
    });

    EXPECT_EXCEPTION(luna::SemanticException, {
        Semantic("while true do local f = function() break end end");
    });

    auto ast = Semantic("while true do break end");
    auto b = ASTFind<luna::BreakStatement>(ast, AcceptAST());
    auto w = ASTFind<luna::WhileStatement>(ast, AcceptAST());
    EXPECT_TRUE(b->loop_ == w);

    ast = Semantic("repeat break until true");
    b = ASTFind<luna::BreakStatement>(ast, AcceptAST());
    auto r = ASTFind<luna::RepeatStatement>(ast, AcceptAST());
    EXPECT_TRUE(b->loop_ == r);

    ast = Semantic("for i = 1, 10 do break end");
    b = ASTFind<luna::BreakStatement>(ast, AcceptAST());
    auto nf = ASTFind<luna::NumericForStatement>(ast, AcceptAST());
    EXPECT_TRUE(b->loop_ == nf);

    ast = Semantic("for k, v in pairs(t) do break end");
    b = ASTFind<luna::BreakStatement>(ast, AcceptAST());
    auto gf = ASTFind<luna::GenericForStatement>(ast, AcceptAST());
    EXPECT_TRUE(b->loop_ == gf);
}